

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Diffusion.cpp
# Opt level: O1

void __thiscall Diffusion::echo_settings(Diffusion *this)

{
  ostringstream *poVar1;
  long lVar2;
  char local_1b9;
  Print local_1b8;
  
  if (verbose != 0) {
    local_1b8.os = amrex::OutStream();
    local_1b8.rank = *(int *)(DAT_00842950 + -0x30);
    local_1b8.comm = *(MPI_Comm *)(DAT_00842950 + -0x48);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8.ss);
    *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
         *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b8.ss,"Diffusion settings...\n",0x16);
    amrex::Print::~Print(&local_1b8);
    local_1b8.os = amrex::OutStream();
    local_1b8.rank = *(int *)(DAT_00842950 + -0x30);
    local_1b8.comm = *(MPI_Comm *)(DAT_00842950 + -0x48);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8.ss);
    *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
         *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b8.ss,"  From diffuse:\n",0x10);
    amrex::Print::~Print(&local_1b8);
    local_1b8.os = amrex::OutStream();
    local_1b8.rank = *(int *)(DAT_00842950 + -0x30);
    local_1b8.comm = *(MPI_Comm *)(DAT_00842950 + -0x48);
    poVar1 = &local_1b8.ss;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
         *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"   max_order           = ",0x19);
    std::ostream::operator<<(poVar1,max_order);
    local_1b9 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,&local_1b9,1);
    amrex::Print::~Print(&local_1b8);
    local_1b8.os = amrex::OutStream();
    local_1b8.rank = *(int *)(DAT_00842950 + -0x30);
    local_1b8.comm = *(MPI_Comm *)(DAT_00842950 + -0x48);
    poVar1 = &local_1b8.ss;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
         *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"   tensor_max_order    = ",0x19);
    std::ostream::operator<<(poVar1,tensor_max_order);
    local_1b9 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,&local_1b9,1);
    amrex::Print::~Print(&local_1b8);
    local_1b8.os = amrex::OutStream();
    local_1b8.rank = *(int *)(DAT_00842950 + -0x30);
    local_1b8.comm = *(MPI_Comm *)(DAT_00842950 + -0x48);
    poVar1 = &local_1b8.ss;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
         *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"   scale_abec          = ",0x19);
    std::ostream::operator<<(poVar1,scale_abec);
    local_1b9 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,&local_1b9,1);
    amrex::Print::~Print(&local_1b8);
    local_1b8.os = amrex::OutStream();
    local_1b8.rank = *(int *)(DAT_00842950 + -0x30);
    local_1b8.comm = *(MPI_Comm *)(DAT_00842950 + -0x48);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8.ss);
    *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
         *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b8.ss,"\n\n  From ns:\n",0xd);
    amrex::Print::~Print(&local_1b8);
    local_1b8.os = amrex::OutStream();
    local_1b8.rank = *(int *)(DAT_00842950 + -0x30);
    local_1b8.comm = *(MPI_Comm *)(DAT_00842950 + -0x48);
    poVar1 = &local_1b8.ss;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
         *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"   do_reflux           = ",0x19);
    std::ostream::operator<<(poVar1,do_reflux);
    local_1b9 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,&local_1b9,1);
    amrex::Print::~Print(&local_1b8);
    local_1b8.os = amrex::OutStream();
    local_1b8.rank = *(int *)(DAT_00842950 + -0x30);
    local_1b8.comm = *(MPI_Comm *)(DAT_00842950 + -0x48);
    poVar1 = &local_1b8.ss;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
         *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"   visc_tol            = ",0x19);
    std::ostream::_M_insert<double>(visc_tol);
    local_1b9 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,&local_1b9,1);
    amrex::Print::~Print(&local_1b8);
    local_1b8.os = amrex::OutStream();
    local_1b8.rank = *(int *)(DAT_00842950 + -0x30);
    local_1b8.comm = *(MPI_Comm *)(DAT_00842950 + -0x48);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8.ss);
    *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
         *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_1b8.ss,"   is_diffusive =",0x11);
    amrex::Print::~Print(&local_1b8);
    if (0 < this->NUM_STATE) {
      poVar1 = &local_1b8.ss;
      lVar2 = 0;
      do {
        local_1b8.os = amrex::OutStream();
        local_1b8.rank = *(int *)(DAT_00842950 + -0x30);
        local_1b8.comm = *(MPI_Comm *)(DAT_00842950 + -0x48);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
        *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
             *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"  ",2);
        std::ostream::operator<<
                  (poVar1,is_diffusive.super_vector<int,_std::allocator<int>_>.
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[lVar2]);
        amrex::Print::~Print(&local_1b8);
        lVar2 = lVar2 + 1;
      } while (lVar2 < this->NUM_STATE);
    }
    local_1b8.os = amrex::OutStream();
    local_1b8.rank = *(int *)(DAT_00842950 + -0x30);
    local_1b8.comm = *(MPI_Comm *)(DAT_00842950 + -0x48);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b8.ss);
    *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
         *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
    local_1b9 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1b8.ss,&local_1b9,1);
    amrex::Print::~Print(&local_1b8);
  }
  return;
}

Assistant:

void
Diffusion::echo_settings () const
{
    //
    // Print out my settings.
    //
  if (verbose)
    {
        amrex::Print() << "Diffusion settings...\n";
        amrex::Print() << "  From diffuse:\n";
        amrex::Print() << "   max_order           = " << max_order           << '\n';
        amrex::Print() << "   tensor_max_order    = " << tensor_max_order    << '\n';
        amrex::Print() << "   scale_abec          = " << scale_abec          << '\n';

        amrex::Print() << "\n\n  From ns:\n";
        amrex::Print() << "   do_reflux           = " << do_reflux << '\n';
        amrex::Print() << "   visc_tol            = " << visc_tol  << '\n';

        amrex::Print() << "   is_diffusive =";
        for (int i =0; i < NUM_STATE; i++)
            amrex::Print() << "  " << is_diffusive[i];

        amrex::Print() << '\n';
    }
}